

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlTextReaderPtr
xmlReaderForIO(xmlInputReadCallback ioread,xmlInputCloseCallback ioclose,void *ioctx,char *URL,
              char *encoding,int options)

{
  int iVar1;
  xmlParserInputBufferPtr input_00;
  xmlParserInputBufferPtr input;
  xmlTextReaderPtr reader;
  int options_local;
  char *encoding_local;
  char *URL_local;
  void *ioctx_local;
  xmlInputCloseCallback ioclose_local;
  xmlInputReadCallback ioread_local;
  
  if (ioread == (xmlInputReadCallback)0x0) {
    ioread_local = (xmlInputReadCallback)0x0;
  }
  else {
    input_00 = xmlParserInputBufferCreateIO(ioread,ioclose,ioctx,XML_CHAR_ENCODING_NONE);
    if (input_00 == (xmlParserInputBufferPtr)0x0) {
      if (ioclose != (xmlInputCloseCallback)0x0) {
        (*ioclose)(ioctx);
      }
      ioread_local = (xmlInputReadCallback)0x0;
    }
    else {
      ioread_local = (xmlInputReadCallback)xmlNewTextReader(input_00,URL);
      if ((xmlTextReaderPtr)ioread_local == (xmlTextReaderPtr)0x0) {
        xmlFreeParserInputBuffer(input_00);
        ioread_local = (xmlInputReadCallback)0x0;
      }
      else {
        ((xmlTextReaderPtr)ioread_local)->allocs = ((xmlTextReaderPtr)ioread_local)->allocs | 1;
        iVar1 = xmlTextReaderSetup((xmlTextReaderPtr)ioread_local,(xmlParserInputBufferPtr)0x0,URL,
                                   encoding,options);
        if (iVar1 < 0) {
          xmlFreeTextReader((xmlTextReaderPtr)ioread_local);
          ioread_local = (xmlInputReadCallback)0x0;
        }
      }
    }
  }
  return (xmlTextReaderPtr)ioread_local;
}

Assistant:

xmlTextReaderPtr
xmlReaderForIO(xmlInputReadCallback ioread, xmlInputCloseCallback ioclose,
               void *ioctx, const char *URL, const char *encoding,
               int options)
{
    xmlTextReaderPtr reader;
    xmlParserInputBufferPtr input;

    if (ioread == NULL)
        return (NULL);

    input = xmlParserInputBufferCreateIO(ioread, ioclose, ioctx,
                                         XML_CHAR_ENCODING_NONE);
    if (input == NULL) {
        if (ioclose != NULL)
            ioclose(ioctx);
        return (NULL);
    }
    reader = xmlNewTextReader(input, URL);
    if (reader == NULL) {
        xmlFreeParserInputBuffer(input);
        return (NULL);
    }
    reader->allocs |= XML_TEXTREADER_INPUT;
    if (xmlTextReaderSetup(reader, NULL, URL, encoding, options) < 0) {
        xmlFreeTextReader(reader);
        return (NULL);
    }
    return (reader);
}